

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_features_disable_recursive(lys_feature *f)

{
  byte *pbVar1;
  ly_set *plVar2;
  ulong uVar3;
  
  pbVar1 = (byte *)((long)&f->flags + 1);
  *pbVar1 = *pbVar1 & 0xfe;
  if ((f->depfeatures != (ly_set *)0x0) && (plVar2 = f->depfeatures, plVar2->number != 0)) {
    uVar3 = 0;
    do {
      if (((plVar2->set).s[uVar3]->flags & 0x100) != 0) {
        lys_features_disable_recursive((lys_feature *)(plVar2->set).s[uVar3]);
      }
      uVar3 = uVar3 + 1;
      plVar2 = f->depfeatures;
    } while (uVar3 < plVar2->number);
  }
  return;
}

Assistant:

static void
lys_features_disable_recursive(struct lys_feature *f)
{
    unsigned int i;
    struct lys_feature *depf;

    /* disable the feature */
    f->flags &= ~LYS_FENABLED;

    /* by disabling feature we have to disable also all features that depends on this feature */
    if (f->depfeatures) {
        for (i = 0; i < f->depfeatures->number; i++) {
            depf = (struct lys_feature *)f->depfeatures->set.g[i];
            if (depf->flags & LYS_FENABLED) {
                lys_features_disable_recursive(depf);
            }
        }
    }
}